

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_token(void)

{
  char cVar1;
  XSValue *pXVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  Status myStatus;
  char iv_2 [4];
  char iv_1 [4];
  char iv_3 [5];
  char v_1 [6];
  char v_2 [8];
  char v_3 [14];
  Status local_74;
  StrX local_70;
  char local_60 [4];
  undefined4 local_5c;
  char local_58 [8];
  char local_50 [8];
  char local_48 [8];
  undefined6 local_40;
  undefined2 local_3a;
  undefined6 uStack_38;
  
  builtin_strncpy(local_50,"4+4=8",6);
  builtin_strncpy(local_48,"Number2",8);
  uStack_38 = 0x2d5f2a3d73;
  local_40 = 0x6843656d6f73;
  local_3a = 0x7261;
  local_5c = 0x620961;
  builtin_strncpy(local_60,"a\nb",4);
  builtin_strncpy(local_58,"a  b",5);
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_token,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 == '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x153f,local_50,local_70.fLocalForm,1);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_token,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 == '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1540,local_48,local_70.fLocalForm,1);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_token,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 == '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1541,&local_40,local_70.fLocalForm,1);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_token,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 != '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1544,&local_5c,local_70.fLocalForm,0);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_token,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 != '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1545,local_60,local_70.fLocalForm,0);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_token,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 != '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1546,local_58,local_70.fLocalForm,0);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  iVar4 = 1;
  do {
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_74 != st_NoActVal) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1560,local_50,local_70.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      pvVar5 = (void *)0x1560;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1560,local_50);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_74 != st_NoActVal) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1561,local_48,local_70.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      pvVar5 = (void *)0x1561;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1561,local_48);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_74 != st_NoActVal) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1562,&local_40,local_70.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      pvVar5 = (void *)0x1562;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1562,&local_40);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1566,&local_5c,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      pvVar5 = (void *)0x1566;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1566,&local_5c);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1568,local_60,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      pvVar5 = (void *)0x1568;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1568,local_60);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x156a,local_58,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      pvVar5 = (void *)0x156a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x156a,local_58);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 == 0);
  iVar4 = 1;
  do {
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if (local_74 != st_NoCanRep) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1587,local_50,local_70.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_70);
        goto LAB_00132472;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1587,local_50);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00132472:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if (local_74 != st_NoCanRep) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1588,local_48,local_70.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_70);
        goto LAB_0013257f;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1588,local_48);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0013257f:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if (local_74 != st_NoCanRep) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1589,&local_40,local_70.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_70);
        goto LAB_00132689;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1589,&local_40);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00132689:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x158d,&local_5c,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        goto LAB_001327af;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x158d,&local_5c);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_001327af:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x158f,local_60,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        goto LAB_001328d5;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x158f,local_60);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_001328d5:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_token,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1591,local_58,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        goto LAB_001329fb;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1591,local_58);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_001329fb:
      errSeen = 1;
    }
    iVar4 = iVar4 + -1;
    if (iVar4 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_token()
{
    const XSValue::DataType dt = XSValue::dt_token;
    bool  toValidate = true;

    const char v_1[]="4+4=8";
    const char v_2[]="Number2";
    const char v_3[]="someChars=*_-";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;

    const char iv_1[]="a\tb";
    const char iv_2[]="a\nb";
    const char iv_3[]="a  b";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}